

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_2::anon_unknown_0::readMultiPart
               (MultiPartInputFile *in,bool reduceMemory,bool reduceTime)

{
  uint uVar1;
  pointer pfVar2;
  pointer puVar3;
  char cVar4;
  int ty;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Header *pHVar12;
  uint *puVar13;
  int *piVar14;
  Compression *pCVar15;
  string *psVar16;
  long lVar17;
  _Rb_tree_node_base *p_Var18;
  _Rb_tree_node_base *p_Var19;
  long lVar20;
  uint64_t j_1;
  pointer phVar21;
  int iVar22;
  int iVar23;
  size_type sVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  int tx;
  ulong uVar29;
  ulong uVar30;
  int y;
  ulong uVar31;
  int x;
  uint uVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  _Rb_tree_node_base *local_198;
  long local_188;
  long local_178;
  InputPart pt;
  bool local_148;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  FrameBuffer i;
  DeepFrameBuffer frameBuffer;
  
  iVar23 = 0;
  local_148 = false;
  do {
    iVar5 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar5 <= iVar23) {
      return local_148;
    }
    iVar5 = (int)in;
    pHVar12 = (Header *)Imf_3_2::MultiPartInputFile::header(iVar5);
    cVar4 = Imf_3_2::hasEnvmap(pHVar12);
    if (((cVar4 != '\0') && (puVar13 = (uint *)Imf_3_2::envmap(pHVar12), 1 < *puVar13)) ||
       ((cVar4 = Imf_3_2::hasDeepImageState(pHVar12), cVar4 != '\0' &&
        (puVar13 = (uint *)Imf_3_2::deepImageState(pHVar12), 3 < *puVar13)))) {
      local_148 = true;
    }
    Imf_3_2::MultiPartInputFile::header(iVar5);
    piVar14 = (int *)Imf_3_2::Header::dataWindow();
    iVar22 = *piVar14;
    iVar8 = piVar14[2];
    pHVar12 = (Header *)Imf_3_2::MultiPartInputFile::header(iVar5);
    iVar6 = Imf_3_2::calculateBytesPerPixel(pHVar12);
    Imf_3_2::MultiPartInputFile::header(iVar5);
    pCVar15 = (Compression *)Imf_3_2::Header::compression();
    iVar7 = Imf_3_2::numLinesInBuffer(*pCVar15);
    uVar31 = (((long)iVar8 - (long)iVar22) + 1) * (long)iVar6 * (long)iVar7;
    bVar35 = 8000000 < uVar31;
    Imf_3_2::MultiPartInputFile::header(iVar5);
    psVar16 = (string *)Imf_3_2::Header::type_abi_cxx11_();
    cVar4 = Imf_3_2::isTiled(psVar16);
    bVar36 = true;
    if (cVar4 != '\0') {
      Imf_3_2::MultiPartInputFile::header(iVar5);
      puVar13 = (uint *)Imf_3_2::Header::tileDescription();
      uVar28 = (ulong)*puVar13;
      uVar26 = puVar13[1] * uVar28 * (long)iVar6;
      bVar36 = uVar26 < 0xf4241;
      bVar35 = 8000000 < ((((long)iVar8 - (long)iVar22) + uVar28) / uVar28) * uVar26 ||
               8000000 < uVar31;
    }
    if ((!reduceMemory) || (!bVar35)) {
      Imf_3_2::InputPart::InputPart(&pt,in,iVar23);
      Imf_3_2::InputPart::header();
      piVar14 = (int *)Imf_3_2::Header::dataWindow();
      iVar5 = piVar14[2];
      iVar22 = *piVar14;
      pHVar12 = (Header *)Imf_3_2::InputPart::header();
      lVar17 = Imf_3_2::calculateBytesPerPixel(pHVar12);
      Imf_3_2::InputPart::header();
      pCVar15 = (Compression *)Imf_3_2::Header::compression();
      iVar8 = Imf_3_2::numLinesInBuffer(*pCVar15);
      sVar24 = ((long)iVar5 - (long)iVar22) + 1;
      if ((!reduceMemory) || (lVar17 * sVar24 * (long)iVar8 < 0x7a1201)) {
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
        i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                  (&halfChannels,sVar24,(allocator_type *)&frameBuffer);
        std::vector<float,_std::allocator<float>_>::vector
                  (&floatChannels,sVar24,(allocator_type *)&frameBuffer);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&uintChannels,sVar24,(allocator_type *)&frameBuffer);
        puVar3 = uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pfVar2 = floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        phVar21 = halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Imf_3_2::InputPart::header();
        Imf_3_2::Header::channels();
        p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        uVar31 = 0;
        while( true ) {
          p_Var19 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var18 == p_Var19) break;
          iVar5 = (int)(uVar31 % 3);
          if (iVar5 == 2) {
            Imf_3_2::Slice::Slice
                      ((Slice *)&frameBuffer,UINT,
                       (char *)(puVar3 + -(long)(iVar22 / *(int *)&p_Var18[9].field_0x4)),4,0,
                       *(int *)&p_Var18[9].field_0x4,*(int *)&p_Var18[9]._M_parent,0.0,false,false);
            Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var18 + 1));
          }
          else if (iVar5 == 1) {
            Imf_3_2::Slice::Slice
                      ((Slice *)&frameBuffer,FLOAT,
                       (char *)(pfVar2 + -(long)(iVar22 / *(int *)&p_Var18[9].field_0x4)),4,0,
                       *(int *)&p_Var18[9].field_0x4,*(int *)&p_Var18[9]._M_parent,0.0,false,false);
            Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var18 + 1));
          }
          else {
            Imf_3_2::Slice::Slice
                      ((Slice *)&frameBuffer,HALF,
                       (char *)(phVar21 + -(long)(iVar22 / *(int *)&p_Var18[9].field_0x4)),2,0,
                       *(int *)&p_Var18[9].field_0x4,*(int *)&p_Var18[9]._M_parent,0.0,false,false);
            Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var18 + 1));
          }
          uVar31 = (ulong)((int)uVar31 + 1);
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        }
        Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&pt);
        for (iVar5 = piVar14[1]; iVar5 <= piVar14[3]; iVar5 = iVar5 + 1) {
          Imf_3_2::InputPart::readPixels((int)&pt);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&floatChannels.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
                  (&halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)&i);
      }
    }
    if (!bVar36 && reduceMemory) {
LAB_00112939:
      if (reduceMemory) goto LAB_0011293e;
LAB_00112949:
      Imf_3_2::MultiPartInputFile::flushPartCache();
      Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                ((DeepScanLineInputPart *)&uintChannels,in,iVar23);
      Imf_3_2::DeepScanLineInputPart::header();
      piVar14 = (int *)Imf_3_2::Header::dataWindow();
      iVar5 = piVar14[2];
      lVar17 = (long)*piVar14;
      pHVar12 = (Header *)Imf_3_2::DeepScanLineInputPart::header();
      lVar20 = Imf_3_2::calculateBytesPerPixel(pHVar12);
      lVar34 = (iVar5 - lVar17) + 1;
      if ((!reduceMemory) || ((ulong)(lVar34 * 4) < 0x7a1201)) {
        Imf_3_2::Header::channels();
        p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        iVar5 = 0;
        local_178 = 0;
        local_188 = 0;
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var19 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var18 == p_Var19) break;
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
          local_188 = local_188 + -1;
          local_178 = local_178 + 1;
          iVar5 = iVar5 + 1;
        }
        halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        Array<unsigned_int>::resizeErase((Array<unsigned_int> *)&halfChannels,lVar34);
        Array<Imf_3_2::Array<void_*>_>::Array
                  ((Array<Imf_3_2::Array<void_*>_> *)&floatChannels,-local_188);
        lVar33 = 0;
        lVar25 = local_178;
        while (bVar35 = lVar25 != 0, lVar25 = lVar25 + -1, bVar35) {
          Array<void_*>::resizeErase
                    ((Array<void_*> *)
                     ((long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish + lVar33),lVar34);
          lVar33 = lVar33 + 0x10;
        }
        DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
        Imf_3_2::Slice::Slice
                  ((Slice *)&i,UINT,
                   (char *)(halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_finish + lVar17 * -2),4,0,1,1,0.0,
                   false,false);
        Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
        Imf_3_2::Header::channels();
        p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        local_188 = 8;
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var19 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var18 == p_Var19) break;
          Imf_3_2::DeepSlice::DeepSlice
                    ((DeepSlice *)&i,FLOAT,
                     (char *)(*(long *)((long)floatChannels.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish + local_188)
                             + lVar17 * -8),8,0,4,1,1,0.0,false,false);
          Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var18 + 1));
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
          local_188 = local_188 + 0x10;
        }
        Imf_3_2::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&uintChannels);
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        i._map._M_t._M_impl._0_8_ = 0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        for (iVar22 = piVar14[1]; iVar22 <= piVar14[3]; iVar22 = iVar22 + 1) {
          Imf_3_2::DeepScanLineInputPart::readPixelSampleCounts((int)&uintChannels);
          sVar24 = 0;
          lVar17 = 0;
          for (lVar25 = 0; iVar8 = iVar5, lVar25 != lVar34; lVar25 = lVar25 + 1) {
            while (iVar8 != 0) {
              uVar28 = (ulong)*(uint *)(halfChannels.
                                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + lVar25 * 2);
              uVar31 = uVar28;
              if (1000 < lVar20 * uVar28) {
                uVar31 = 0;
              }
              lVar17 = lVar17 + uVar28;
              if (!reduceMemory) {
                uVar31 = uVar28;
              }
              sVar24 = sVar24 + uVar31;
              iVar8 = iVar8 + -1;
            }
          }
          if ((!reduceMemory) || (lVar17 + sVar24 < 0x1000)) {
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)&i,sVar24);
            lVar17 = 0;
            for (lVar25 = 0; lVar25 != lVar34; lVar25 = lVar25 + 1) {
              lVar33 = 8;
              lVar27 = local_178;
              while (bVar35 = lVar27 != 0, lVar27 = lVar27 + -1, bVar35) {
                if (((ulong)*(uint *)(halfChannels.
                                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar25 * 2) == 0)
                   || (1000 < (ulong)*(uint *)(halfChannels.
                                               super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                               ._M_impl.super__Vector_impl_data._M_finish +
                                              lVar25 * 2) * lVar20 && reduceMemory)) {
                  *(undefined8 *)
                   (*(long *)((long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + lVar33) + lVar25 * 8
                   ) = 0;
                }
                else {
                  *(long *)(*(long *)((long)floatChannels.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_finish + lVar33) +
                           lVar25 * 8) = lVar17 * 4 + i._map._M_t._M_impl._0_8_;
                  lVar17 = lVar17 + (ulong)*(uint *)(halfChannels.
                                                                                                          
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar25 * 2);
                }
                lVar33 = lVar33 + 0x10;
              }
            }
            Imf_3_2::DeepScanLineInputPart::readPixels((int)&uintChannels);
          }
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&i);
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                     *)&frameBuffer);
        Array<Imf_3_2::Array<void_*>_>::~Array((Array<Imf_3_2::Array<void_*>_> *)&floatChannels);
        Array<unsigned_int>::~Array((Array<unsigned_int> *)&halfChannels);
      }
    }
    else {
      Imf_3_2::MultiPartInputFile::flushPartCache();
      Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&pt,in,iVar23);
      Imf_3_2::TiledInputPart::header();
      piVar14 = (int *)Imf_3_2::Header::dataWindow();
      iVar5 = piVar14[2];
      iVar22 = *piVar14;
      iVar8 = Imf_3_2::TiledInputPart::numXLevels();
      iVar6 = Imf_3_2::TiledInputPart::numYLevels();
      Imf_3_2::TiledInputPart::header();
      piVar14 = (int *)Imf_3_2::Header::tileDescription();
      pHVar12 = (Header *)Imf_3_2::TiledInputPart::header();
      lVar17 = Imf_3_2::calculateBytesPerPixel(pHVar12);
      sVar24 = ((long)iVar5 - (long)iVar22) + 1;
      if ((!reduceMemory) ||
         ((lVar17 * sVar24 < 0x7a1201 && (lVar17 * (ulong)(uint)(piVar14[1] * *piVar14) < 0xf4241)))
         ) {
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
        i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                  (&halfChannels,sVar24,(allocator_type *)&frameBuffer);
        std::vector<float,_std::allocator<float>_>::vector
                  (&floatChannels,sVar24,(allocator_type *)&frameBuffer);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&uintChannels,sVar24,(allocator_type *)&frameBuffer);
        Imf_3_2::TiledInputPart::header();
        Imf_3_2::Header::channels();
        p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        uVar32 = 0;
        while( true ) {
          p_Var19 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var18 == p_Var19) break;
          if (uVar32 % 3 == 2) {
LAB_001125c5:
            Imf_3_2::Slice::Slice
                      ((Slice *)&frameBuffer,UINT,
                       (char *)(uintChannels.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                               -(iVar22 / *(int *)&p_Var18[9].field_0x4)),4,0,
                       *(int *)&p_Var18[9].field_0x4,*(int *)&p_Var18[9]._M_parent,0.0,false,false);
            Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var18 + 1));
          }
          else {
            if (uVar32 % 3 == 1) {
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,FLOAT,
                         (char *)(floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                                 -(iVar22 / *(int *)&p_Var18[9].field_0x4)),4,0,
                         *(int *)&p_Var18[9].field_0x4,*(int *)&p_Var18[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var18 + 1));
              goto LAB_001125c5;
            }
            Imf_3_2::Slice::Slice
                      ((Slice *)&frameBuffer,HALF,
                       (char *)(halfChannels.
                                super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                               -(iVar22 / *(int *)&p_Var18[9].field_0x4)),2,0,
                       *(int *)&p_Var18[9].field_0x4,*(int *)&p_Var18[9]._M_parent,0.0,false,false);
            Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var18 + 1));
          }
          uVar32 = uVar32 + 1;
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        }
        Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&pt);
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        for (iVar5 = 0; iVar5 != iVar6; iVar5 = iVar5 + 1) {
          for (iVar22 = 0; iVar22 != iVar8; iVar22 = iVar22 + 1) {
            for (iVar7 = 0; iVar9 = Imf_3_2::TiledInputPart::numYTiles((int)&pt), iVar7 < iVar9;
                iVar7 = iVar7 + 1) {
              for (iVar9 = 0; iVar10 = Imf_3_2::TiledInputPart::numXTiles((int)&pt), iVar9 < iVar10;
                  iVar9 = iVar9 + 1) {
                Imf_3_2::TiledInputPart::readTile((int)&pt,iVar9,iVar7,iVar22);
              }
            }
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&floatChannels.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~_Vector_base
                  (&halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>);
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)&i);
        goto LAB_00112939;
      }
LAB_0011293e:
      if (!bVar35) goto LAB_00112949;
    }
    if (bVar36 || !reduceMemory) {
      Imf_3_2::MultiPartInputFile::flushPartCache();
      Imf_3_2::DeepTiledInputPart::DeepTiledInputPart((DeepTiledInputPart *)&uintChannels,in,iVar23)
      ;
      Imf_3_2::DeepTiledInputPart::header();
      halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pHVar12 = (Header *)Imf_3_2::DeepTiledInputPart::header();
      iVar5 = Imf_3_2::calculateBytesPerPixel(pHVar12);
      Imf_3_2::DeepTiledInputPart::header();
      puVar13 = (uint *)Imf_3_2::Header::tileDescription();
      uVar32 = *puVar13;
      lVar17 = (long)(int)uVar32;
      uVar1 = puVar13[1];
      iVar8 = Imf_3_2::DeepTiledInputPart::numYLevels();
      iVar22 = Imf_3_2::DeepTiledInputPart::numXLevels();
      Array2D<unsigned_int>::resizeErase
                ((Array2D<unsigned_int> *)&halfChannels,(long)(int)uVar1,lVar17);
      Imf_3_2::Header::channels();
      local_198 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      lVar34 = 0;
      lVar20 = 0;
      while( true ) {
        Imf_3_2::Header::channels();
        p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
        if (local_198 == p_Var18) break;
        local_198 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_198);
        lVar20 = lVar20 + -1;
        lVar34 = lVar34 + 1;
      }
      Array<Imf_3_2::Array2D<float_*>_>::Array
                ((Array<Imf_3_2::Array2D<float_*>_> *)&floatChannels,-lVar20);
      lVar33 = 0;
      lVar25 = lVar34;
      while (bVar35 = lVar25 != 0, lVar25 = lVar25 + -1, bVar35) {
        Array2D<float_*>::resizeErase
                  ((Array2D<float_*> *)
                   ((long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar33),(long)(int)uVar1,lVar17);
        lVar33 = lVar33 + 0x18;
      }
      DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
      Imf_3_2::Slice::Slice
                ((Slice *)&i,UINT,
                 (char *)halfChannels.
                         super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,4,lVar17 * 4,1,1,0.0,true
                 ,true);
      Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
      Imf_3_2::Header::channels();
      local_198 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
      local_188 = 0x10;
      while( true ) {
        Imf_3_2::Header::channels();
        p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
        if (local_198 == p_Var18) break;
        Imf_3_2::DeepSlice::DeepSlice
                  ((DeepSlice *)&i,FLOAT,
                   *(char **)((long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + local_188),8,
                   (long)(int)(uVar32 * 8),4,1,1,0.0,true,true);
        Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(local_198 + 1));
        local_198 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_198);
        local_188 = local_188 + 0x18;
      }
      Imf_3_2::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)&uintChannels);
      i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      if ((int)uVar32 < 1) {
        uVar32 = 0;
      }
      i._map._M_t._M_impl._0_8_ = 0;
      i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      i._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      uVar31 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar31 = 0;
      }
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      for (iVar6 = 0; iVar6 != iVar8; iVar6 = iVar6 + 1) {
        for (iVar7 = 0; iVar7 != iVar22; iVar7 = iVar7 + 1) {
          for (iVar9 = 0; iVar10 = Imf_3_2::DeepTiledInputPart::numYTiles((int)&uintChannels),
              iVar9 < iVar10; iVar9 = iVar9 + 1) {
            for (iVar10 = 0; iVar11 = Imf_3_2::DeepTiledInputPart::numXTiles((int)&uintChannels),
                iVar10 < iVar11; iVar10 = iVar10 + 1) {
              Imf_3_2::DeepTiledInputPart::readPixelSampleCounts
                        ((int)&uintChannels,iVar10,iVar9,iVar10,iVar9,iVar7);
              sVar24 = 0;
              lVar17 = 0;
              phVar21 = halfChannels.
                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
              for (uVar28 = 0; uVar28 != uVar31; uVar28 = uVar28 + 1) {
                for (uVar26 = 0; uVar32 != uVar26; uVar26 = uVar26 + 1) {
                  uVar30 = (ulong)(uint)((int)-lVar20 * *(int *)(phVar21 + uVar26 * 2));
                  lVar17 = lVar17 + uVar30;
                  uVar29 = 0;
                  if ((uint)(*(int *)(phVar21 + uVar26 * 2) * iVar5) < 0x1000) {
                    uVar29 = uVar30;
                  }
                  if (!reduceMemory) {
                    uVar29 = uVar30;
                  }
                  sVar24 = sVar24 + uVar29;
                }
                phVar21 = phVar21 + (long)halfChannels.
                                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                          ._M_impl.super__Vector_impl_data._M_finish * 2;
              }
              if ((sVar24 != 0) && ((!reduceMemory || ((lVar17 + sVar24) * (long)iVar5 < 1000)))) {
                std::vector<float,_std::allocator<float>_>::resize
                          ((vector<float,_std::allocator<float>_> *)&i,sVar24);
                lVar17 = 0;
                for (uVar28 = 0; uVar28 != uVar31; uVar28 = uVar28 + 1) {
                  for (uVar26 = 0; uVar26 != uVar32; uVar26 = uVar26 + 1) {
                    if ((reduceMemory) &&
                       (999 < (uint)(*(int *)(halfChannels.
                                              super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                             (long)halfChannels.
                                                                                                      
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish *
                                             uVar28 * 2 + uVar26 * 2) * iVar5))) {
                      lVar25 = 0x10;
                      lVar33 = lVar34;
                      while (bVar35 = lVar33 != 0, lVar33 = lVar33 + -1, bVar35) {
                        *(undefined8 *)
                         (*(long *)((long)floatChannels.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_finish + lVar25 + -8) * uVar28
                          * 8 + *(long *)((long)floatChannels.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_finish + lVar25)
                         + uVar26 * 8) = 0;
                        lVar25 = lVar25 + 0x18;
                      }
                    }
                    else {
                      lVar25 = 0x10;
                      lVar33 = lVar34;
                      while (bVar35 = lVar33 != 0, lVar33 = lVar33 + -1, bVar35) {
                        *(long *)(*(long *)((long)floatChannels.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                           lVar25 + -8) * uVar28 * 8 +
                                  *(long *)((long)floatChannels.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + lVar25
                                           ) + uVar26 * 8) = lVar17 * 4 + i._map._M_t._M_impl._0_8_;
                        lVar17 = lVar17 + (ulong)*(uint *)(halfChannels.
                                                                                                                      
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + (long)halfChannels.
                                                                                                                    
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish *
                                                  uVar28 * 2 + uVar26 * 2);
                        lVar25 = lVar25 + 0x18;
                      }
                    }
                  }
                }
                Imf_3_2::DeepTiledInputPart::readTile((int)&uintChannels,iVar10,iVar9,iVar7);
              }
            }
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&i);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Array<Imf_3_2::Array2D<float_*>_>::~Array((Array<Imf_3_2::Array2D<float_*>_> *)&floatChannels)
      ;
      Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&halfChannels);
    }
    iVar23 = iVar23 + 1;
  } while( true );
}

Assistant:

bool
readMultiPart (MultiPartInputFile& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    for (int part = 0; part < in.parts (); ++part)
    {

        if (!enumsValid (in.header (part))) { threw = true; }

        bool     widePart      = false;
        bool     largeTiles    = false;
        Box2i    b             = in.header (part).dataWindow ();
        int      bytesPerPixel = calculateBytesPerPixel (in.header (part));
        uint64_t imageWidth    = static_cast<uint64_t> (b.max.x) -
                              static_cast<uint64_t> (b.min.x) + 1ll;
        uint64_t scanlinesInBuffer =
            numLinesInBuffer (in.header (part).compression ());

        //
        // very wide scanline parts take excessive memory to read.
        // compute memory required to store a group of scanlines
        // so tests can be skipped when reduceMemory is set
        //

        if (imageWidth * bytesPerPixel * scanlinesInBuffer >
            gMaxBytesPerScanline)
        {
            widePart = true;
        }
        //
        // significant memory is also required to read a tiled part
        // using the scanline interface with tall tiles - the scanlineAPI
        // needs to allocate memory to store an entire row of tiles
        //
        if (isTiled (in.header (part).type ()))
        {
            const TileDescription& tileDescription =
                in.header (part).tileDescription ();

            uint64_t tilesPerScanline =
                (imageWidth + tileDescription.xSize - 1ll) /
                tileDescription.xSize;
            uint64_t tileSize = static_cast<uint64_t> (tileDescription.xSize) *
                                static_cast<uint64_t> (tileDescription.ySize);

            if (tileSize * tilesPerScanline * bytesPerPixel >
                gMaxTileBytesPerScanline)
            {
                widePart = true;
            }
            if (tileSize * bytesPerPixel > gMaxTileBytes) { largeTiles = true; }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;
            try
            {
                InputPart pt (in, part);
                gotThrow = readScanline (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }
            // only 'DeepTiled' parts are expected to throw
            // all others are an error
            if (gotThrow && in.header (part).type () != DEEPTILE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                TiledInputPart pt (in, part);
                gotThrow = readTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == TILEDIMAGE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepScanLineInputPart pt (in, part);
                gotThrow = readDeepScanLine (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPSCANLINE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepTiledInputPart pt (in, part);
                gotThrow = readDeepTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPTILE)
            {
                threw = true;
            }
        }
    }

    return threw;
}